

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  undefined8 *puVar1;
  byte bVar2;
  ushort uVar3;
  int iCur;
  u32 uVar4;
  ExprList *pEVar5;
  Select *pSVar6;
  SrcList *pSVar7;
  Table *pTab;
  Index *pIdx;
  Vdbe *p;
  char cVar8;
  bool bVar9;
  u8 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int target;
  int p3;
  int iVar15;
  int iVar16;
  Vdbe *p_00;
  Expr *pEVar17;
  KeyInfo *p_01;
  CollSeq *pCVar18;
  Expr *pEVar19;
  VdbeOp *pVVar20;
  char aff2;
  long lVar21;
  char *pcVar22;
  Index **ppIVar23;
  long lVar24;
  ExprList_item *pEVar25;
  ulong uVar26;
  ulong uVar27;
  ExprList_item *pEVar28;
  ulong uVar29;
  SrcList **ppSVar30;
  ulong local_80;
  SelectDest dest;
  
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  p_00 = sqlite3GetVdbe(pParse);
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar5 = ((pX->x).pSelect)->pEList;
    uVar13 = pEVar5->nExpr;
    pEVar25 = pEVar5->a;
    uVar26 = 0;
    uVar27 = 0;
    if (0 < (int)uVar13) {
      uVar27 = (ulong)uVar13;
    }
    for (; uVar27 != uVar26; uVar26 = uVar26 + 1) {
      iVar11 = sqlite3ExprCanBeNull(pEVar25->pExpr);
      if (iVar11 != 0) {
        uVar27 = uVar26 & 0xffffffff;
        break;
      }
      pEVar25 = pEVar25 + 1;
    }
    if ((uint)uVar27 == uVar13) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar6 = (pX->x).pSelect, pSVar6->pPrior == (Select *)0x0)) &&
       (((pSVar6->selFlags & 9) == 0 && (pSVar6->pLimit == (Expr *)0x0)))) &&
      ((pSVar6->pWhere == (Expr *)0x0 &&
       ((pSVar7 = pSVar6->pSrc, pSVar7->nSrc == 1 && (pSVar7->a[0].pSelect == (Select *)0x0)))))) &&
     (pTab = pSVar7->a[0].pTab, pTab->nModuleArg == 0)) {
    iVar11 = 1;
    uVar13 = pSVar6->pEList->nExpr;
    pEVar25 = pSVar6->pEList->a;
    uVar26 = 0;
    if (0 < (int)uVar13) {
      uVar26 = (ulong)uVar13;
    }
    lVar24 = 0;
LAB_00167796:
    if (uVar26 * 0x20 + 0x20 != lVar24 + 0x20) goto code_r0x0016779f;
    iVar12 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    iVar12 = (int)(short)iVar12;
    sqlite3CodeVerifySchema(pParse,iVar12);
    sqlite3TableLock(pParse,iVar12,pTab->tnum,'\0',pTab->zName);
    if ((uVar13 != 1) || (-1 < pEVar25->pExpr->iColumn)) {
      bVar9 = true;
      lVar24 = 0;
      pEVar28 = pEVar25;
      while ((lVar24 < (int)uVar13 && (bVar9))) {
        pEVar17 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar24);
        lVar21 = (long)pEVar28->pExpr->iColumn;
        if (lVar21 < 0) {
          aff2 = 'D';
        }
        else {
          aff2 = pTab->aCol[lVar21].affinity;
        }
        cVar8 = sqlite3CompareAffinity(pEVar17,aff2);
        bVar9 = 'B' < aff2 || (byte)(cVar8 + 0xbfU) < 2;
        lVar24 = lVar24 + 1;
        pEVar28 = pEVar28 + 1;
      }
      if (bVar9) {
        ppIVar23 = &pTab->pIndex;
        iVar11 = 0;
        while ((pIdx = *ppIVar23, pIdx != (Index *)0x0 && (iVar11 == 0))) {
          uVar3 = pIdx->nColumn;
          iVar11 = 0;
          iVar14 = 0;
          if ((((int)uVar13 <= (int)(uint)uVar3) &&
              ((uVar3 < 0x3f && (pIdx->pPartIdxWhere == (Expr *)0x0)))) &&
             ((iVar11 = iVar14, (inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar13 &&
               ((uVar3 <= uVar13 || (pIdx->onError != '\0')))))))) {
            local_80 = 0;
            for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
              pEVar19 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar27);
              pEVar17 = pEVar25[uVar27].pExpr;
              pCVar18 = sqlite3BinaryCompareCollSeq(pParse,pEVar19,pEVar17);
              uVar29 = 0;
              while( true ) {
                if (uVar13 == uVar29) goto LAB_001679c9;
                if ((pIdx->aiColumn[uVar29] == pEVar17->iColumn) &&
                   ((pCVar18 == (CollSeq *)0x0 ||
                    (iVar14 = sqlite3StrICmp(pCVar18->zName,pIdx->azColl[uVar29]), iVar14 == 0))))
                break;
                uVar29 = uVar29 + 1;
              }
              if ((uVar13 == (uint)uVar29) || ((local_80 >> (uVar29 & 0x3f) & 1) != 0)) break;
              if (aiMap != (int *)0x0) {
                aiMap[uVar27] = (uint)uVar29;
              }
              local_80 = local_80 | 1L << ((byte)uVar29 & 0x3f);
            }
LAB_001679c9:
            if ((local_80 ^ -1L << ((byte)uVar13 & 0x3f)) == 0xffffffffffffffff) {
              iVar11 = sqlite3VdbeAddOp0(p_00,0x11);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(p_00,0x6c,iCur,pIdx->tnum,iVar12);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar2 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar14 = pParse->nMem + 1;
                pParse->nMem = iVar14;
                *prRhsHasNull = iVar14;
                if (uVar13 == 1) {
                  sqlite3SetHasNullFlag(p_00,iCur,iVar14);
                }
              }
              sqlite3VdbeJumpHere(p_00,iVar11);
              iVar11 = bVar2 + 3;
            }
          }
          ppIVar23 = &pIdx->pNext;
        }
        if (iVar11 != 0) goto LAB_00167f4a;
      }
      goto LAB_00167ac1;
    }
    iVar14 = sqlite3VdbeAddOp0(p_00,0x11);
    sqlite3OpenTable(pParse,iCur,iVar12,pTab,0x6c);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR");
    sqlite3VdbeJumpHere(p_00,iVar14);
    goto LAB_00167f4a;
  }
LAB_00167ac1:
  if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
    pEVar17 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    iVar12 = sqlite3ExprIsConstant(pX);
    pX->pLeft = pEVar17;
    iVar11 = 5;
    if ((iVar12 == 0) || (((pX->x).pList)->nExpr < 3)) goto LAB_00167f4a;
  }
  uVar4 = pParse->nQueryLoop;
  if ((inFlags & 4) == 0) {
    if (prRhsHasNull == (int *)0x0) goto LAB_00167b28;
    iVar11 = pParse->nMem + 1;
    pParse->nMem = iVar11;
    *prRhsHasNull = iVar11;
  }
  else {
    pParse->nQueryLoop = 0;
LAB_00167b28:
    iVar11 = 0;
  }
  p = pParse->pVdbe;
  uVar13 = pX->flags;
  iVar12 = 0;
  if (((uVar13 & 0x20) == 0) && (iVar12 = 0, pParse->iSelfTab == 0)) {
    if ((uVar13 >> 0x19 & 1) == 0) {
      pX->flags = uVar13 | 0x2000000;
      iVar12 = pParse->nMem + 1;
      pParse->nMem = iVar12;
      (pX->y).sub.regReturn = iVar12;
      iVar12 = sqlite3VdbeAddOp2(p,0x46,0,iVar12);
      (pX->y).sub.iAddr = iVar12 + 1;
      iVar12 = sqlite3VdbeAddOp0(p,0x11);
      goto LAB_00167b8a;
    }
    iVar12 = sqlite3VdbeAddOp0(p,0x11);
    if ((pX->flags & 0x800) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pX->x).pSelect)->selId);
    }
    sqlite3VdbeAddOp2(p,0xc,(pX->y).sub.regReturn,(pX->y).sub.iAddr);
    sqlite3VdbeAddOp2(p,0x6f,iCur,pX->iTable);
    sqlite3VdbeJumpHere(p,iVar12);
  }
  else {
LAB_00167b8a:
    pEVar17 = pX->pLeft;
    uVar13 = sqlite3ExprVectorSize(pEVar17);
    pX->iTable = iCur;
    iVar14 = sqlite3VdbeAddOp2(p,0x71,iCur,uVar13);
    p_01 = sqlite3KeyInfoAlloc(pParse->db,uVar13,1);
    pSVar6 = (pX->x).pSelect;
    if ((pX->flags & 0x800) == 0) {
      if (pSVar6 != (Select *)0x0) {
        uVar10 = sqlite3ExprAffinity(pEVar17);
        dest.eDest = 'A';
        if (uVar10 != '\0') {
          dest.eDest = uVar10;
        }
        if (p_01 != (KeyInfo *)0x0) {
          pCVar18 = sqlite3ExprCollSeq(pParse,pX->pLeft);
          p_01->aColl[0] = pCVar18;
        }
        target = sqlite3GetTempReg(pParse);
        p3 = sqlite3GetTempReg(pParse);
        ppSVar30 = (SrcList **)&pSVar6->op;
        for (iVar16 = *(int *)&pSVar6->pEList; 0 < iVar16; iVar16 = iVar16 + -1) {
          pSVar7 = *ppSVar30;
          if (iVar12 == 0) {
LAB_00167c83:
            iVar12 = 0;
          }
          else {
            iVar15 = sqlite3ExprIsConstant((Expr *)pSVar7);
            if (iVar15 == 0) {
              sqlite3VdbeChangeToNoop(p,iVar12);
              goto LAB_00167c83;
            }
          }
          iVar15 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar7,target);
          sqlite3VdbeAddOp4(p,0x5c,iVar15,1,p3,(char *)&dest,1);
          sqlite3VdbeAddOp4Int(p,0x84,iCur,p3,iVar15,1);
          ppSVar30 = ppSVar30 + 4;
        }
        if (target != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = target;
          }
        }
        if (p3 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = p3;
          }
        }
      }
    }
    else {
      pEVar5 = pSVar6->pEList;
      pcVar22 = "";
      if (iVar12 == 0) {
        pcVar22 = "CORRELATED ";
      }
      sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar22,(ulong)pSVar6->selId);
      if (pEVar5->nExpr == uVar13) {
        dest.eDest = '\v';
        dest.iSdst = 0;
        dest.nSdst = 0;
        dest.iSDParm = iCur;
        dest.zAffSdst = exprINAffinity(pParse,pX);
        pSVar6->iLimit = 0;
        iVar16 = sqlite3Select(pParse,pSVar6,&dest);
        sqlite3DbFree(pParse->db,dest.zAffSdst);
        if (iVar16 != 0) {
          sqlite3KeyInfoUnref(p_01);
          goto LAB_00167f27;
        }
        pEVar25 = pEVar5->a;
        uVar27 = 0;
        uVar26 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar26 = uVar27;
        }
        for (; uVar26 != uVar27; uVar27 = uVar27 + 1) {
          pEVar19 = sqlite3VectorFieldSubexpr(pEVar17,(int)uVar27);
          pCVar18 = sqlite3BinaryCompareCollSeq(pParse,pEVar19,pEVar25->pExpr);
          p_01->aColl[uVar27] = pCVar18;
          pEVar25 = pEVar25 + 1;
        }
      }
    }
    if (p_01 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,iVar14,(char *)p_01,-9);
    }
    if (iVar12 != 0) {
      sqlite3VdbeJumpHere(p,iVar12);
      sqlite3VdbeAddOp1(p,0x42,(pX->y).sub.regReturn);
      iVar12 = p->nOp;
      pVVar20 = sqlite3VdbeGetOp(p,(pX->y).sub.iAddr + -1);
      pVVar20->p1 = iVar12 + -1;
    }
  }
LAB_00167f27:
  if (iVar11 != 0) {
    sqlite3SetHasNullFlag(p_00,iCur,iVar11);
  }
  pParse->nQueryLoop = uVar4;
  iVar11 = 2;
LAB_00167f4a:
  if ((aiMap != (int *)0x0) && (iVar11 - 5U < 0xfffffffe)) {
    uVar13 = sqlite3ExprVectorSize(pX->pLeft);
    uVar27 = 0;
    uVar26 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar26 = uVar27;
    }
    for (; uVar26 != uVar27; uVar27 = uVar27 + 1) {
      aiMap[uVar27] = (int)uVar27;
    }
  }
  *piTab = iCur;
  return iVar11;
code_r0x0016779f:
  puVar1 = (undefined8 *)((long)&pEVar25->pExpr + lVar24);
  lVar24 = lVar24 + 0x20;
  if (*(char *)*puVar1 != -0x5e) goto LAB_00167ac1;
  goto LAB_00167796;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}